

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1client.c
# Opt level: O2

void on_send_request(h2o_socket_t *sock,char *err)

{
  st_h2o_http1client_private_t *client;
  h2o_http1client_ctx_t *phVar1;
  
  client = (st_h2o_http1client_private_t *)sock->data;
  h2o_timeout_unlink(&client->_timeout);
  if (err != (char *)0x0) {
    on_error_before_head(client,"I/O error (send request)");
    return;
  }
  h2o_socket_read_start((client->super).sock,on_head);
  (client->_timeout).cb = on_head_timeout;
  phVar1 = (client->super).ctx;
  h2o_timeout_link(phVar1->loop,phVar1->io_timeout,&client->_timeout);
  return;
}

Assistant:

static void on_send_request(h2o_socket_t *sock, const char *err)
{
    struct st_h2o_http1client_private_t *client = sock->data;

    h2o_timeout_unlink(&client->_timeout);

    if (err != NULL) {
        on_error_before_head(client, "I/O error (send request)");
        return;
    }

    h2o_socket_read_start(client->super.sock, on_head);
    client->_timeout.cb = on_head_timeout;
    h2o_timeout_link(client->super.ctx->loop, client->super.ctx->io_timeout, &client->_timeout);
}